

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDuplicateEdgeWithMultipleOutputs::~ParserTestDuplicateEdgeWithMultipleOutputs
          (ParserTestDuplicateEdgeWithMultipleOutputs *this)

{
  ParserTestDuplicateEdgeWithMultipleOutputs *this_local;
  
  ~ParserTestDuplicateEdgeWithMultipleOutputs(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateEdgeWithMultipleOutputs) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out1 out2: cat in1\n"
"build out1: cat in2\n"
"build final: cat out1\n"
));
  // AssertParse() checks that the generated build graph is self-consistent.
  // That's all the checking that this test needs.
}